

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void lm_init(deflate_state *s)

{
  deflate_state *s_local;
  
  s->window_size = (ulong)s->w_size << 1;
  s->head[s->hash_size - 1] = 0;
  memset(s->head,0,(ulong)(s->hash_size - 1) << 1);
  s->max_lazy_match = (uint)configuration_table[s->level].max_lazy;
  s->good_match = (uint)configuration_table[s->level].good_length;
  s->nice_match = (uint)configuration_table[s->level].nice_length;
  s->max_chain_length = (uint)configuration_table[s->level].max_chain;
  s->strstart = 0;
  s->block_start = 0;
  s->lookahead = 0;
  s->insert = 0;
  s->prev_length = 2;
  s->match_length = 2;
  s->match_available = 0;
  s->ins_h = 0;
  return;
}

Assistant:

local void lm_init (s)
    deflate_state *s;
{
    s->window_size = (ulg)2L*s->w_size;

    CLEAR_HASH(s);

    /* Set the default configuration parameters:
     */
    s->max_lazy_match   = configuration_table[s->level].max_lazy;
    s->good_match       = configuration_table[s->level].good_length;
    s->nice_match       = configuration_table[s->level].nice_length;
    s->max_chain_length = configuration_table[s->level].max_chain;

    s->strstart = 0;
    s->block_start = 0L;
    s->lookahead = 0;
    s->insert = 0;
    s->match_length = s->prev_length = MIN_MATCH-1;
    s->match_available = 0;
    s->ins_h = 0;
#ifndef FASTEST
#ifdef ASMV
    match_init(); /* initialize the asm code */
#endif
#endif
}